

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# serialize_tests.cpp
# Opt level: O3

void serialize_tests::Derived::
     SerializationOps<ParamsStream<DataStream&,serialize_tests::DerivedAndBaseFormat>,serialize_tests::Derived_const,ActionSerialize>
               (Base *obj,ParamsStream<DataStream_&,_serialize_tests::DerivedAndBaseFormat> *s)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  long in_FS_OFFSET;
  string_view str;
  string_view str_00;
  string local_40;
  long local_20;
  
  local_20 = *(long *)(in_FS_OFFSET + 0x28);
  paVar1 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
            *)s->m_params;
  local_40._M_dataplus._M_p = (pointer)paVar1;
  local_40._M_string_length = (size_type)s;
  Base::
  Serialize<ParamsStream<ParamsStream<DataStream&,serialize_tests::DerivedAndBaseFormat>&,serialize_tests::BaseFormat>>
            (obj,(ParamsStream<ParamsStream<DataStream_&,_serialize_tests::DerivedAndBaseFormat>_&,_serialize_tests::BaseFormat>
                  *)&local_40);
  if (*(int *)((long)paVar1 + 4) == 0) {
    str_00._M_str = *(char **)(obj + 8);
    str_00._M_len = *(size_t *)(obj + 0x10);
    ToLower_abi_cxx11_(&local_40,str_00);
  }
  else {
    str._M_str = *(char **)(obj + 8);
    str._M_len = *(size_t *)(obj + 0x10);
    ToUpper_abi_cxx11_(&local_40,str);
  }
  Serialize<ParamsStream<DataStream&,serialize_tests::DerivedAndBaseFormat>,char>(s,&local_40);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_40._M_dataplus._M_p != &local_40.field_2) {
    operator_delete(local_40._M_dataplus._M_p,local_40.field_2._M_allocated_capacity + 1);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

SERIALIZE_METHODS(Derived, obj)
    {
        auto& fmt = SER_PARAMS(DerivedAndBaseFormat);
        READWRITE(fmt.m_base_format(AsBase<Base>(obj)));

        if (ser_action.ForRead()) {
            std::string str;
            s >> str;
            SER_READ(obj, obj.m_derived_data = str);
        } else {
            s << (fmt.m_derived_format == DerivedAndBaseFormat::DerivedFormat::LOWER ?
                      ToLower(obj.m_derived_data) :
                      ToUpper(obj.m_derived_data));
        }
    }